

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

int canvas_undo_connect(_glist *x,void *z,int action)

{
  if (action == 1) {
    action = 2;
  }
  else if (action == 2) {
    action = 1;
  }
  canvas_undo_disconnect(x,z,action);
  return 1;
}

Assistant:

int canvas_undo_connect(t_canvas *x, void *z, int action)
{
    int myaction;
    if (action == UNDO_UNDO)
        myaction = UNDO_REDO;
    else if (action == UNDO_REDO)
        myaction = UNDO_UNDO;
    else myaction = action;
    canvas_undo_disconnect(x, z, myaction);
    return 1;
}